

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trace.cpp
# Opt level: O0

void __thiscall MppTraceService::MppTraceService(MppTraceService *this)

{
  int iVar1;
  uint local_14;
  RK_U32 i;
  MppTraceService *this_local;
  
  local_14 = 0;
  do {
    if (2 < local_14) {
      return;
    }
    iVar1 = access(MppTraceService::ftrace_paths[local_14],0);
    if (iVar1 == 0) {
      iVar1 = open(MppTraceService::ftrace_paths[local_14],0x80001);
      this->mTraceFd = iVar1;
      if (-1 < this->mTraceFd) {
        return;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

MppTraceService::MppTraceService()
{
    static const char *ftrace_paths[] = {
        "/sys/kernel/debug/tracing/trace_marker",
        "/debug/tracing/trace_marker",
        "/debugfs/tracing/trace_marker",
    };

    RK_U32 i;

    for (i = 0; i < MPP_ARRAY_ELEMS(ftrace_paths); i++) {
        if (!access(ftrace_paths[i], F_OK)) {
            mTraceFd = open(ftrace_paths[i], O_WRONLY | O_CLOEXEC);
            if (mTraceFd >= 0)
                break;
        }
    }
}